

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_logit_bias_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  llama_sampler_context_t pvVar1;
  value_type *pvVar2;
  llama_token_data *plVar3;
  int *piVar4;
  int *piVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  iterator __begin2;
  int *piVar9;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__x;
  
  pvVar1 = smpl->ctx;
  __x = *(value_type **)((long)pvVar1 + 8);
  pvVar2 = *(value_type **)((long)pvVar1 + 0x10);
  if (__x != pvVar2) {
    if (*(long *)((long)pvVar1 + 0x28) != *(long *)((long)pvVar1 + 0x20)) {
      *(long *)((long)pvVar1 + 0x28) = *(long *)((long)pvVar1 + 0x20);
    }
    for (; __x != pvVar2; __x = __x + 1) {
      uVar7 = (ulong)__x->token;
      if ((((long)uVar7 < 0) || (cur_p->size <= uVar7)) ||
         (plVar3 = cur_p->data, plVar3[uVar7].id != __x->token)) {
        std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::push_back
                  ((vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *)
                   ((long)pvVar1 + 0x20),__x);
      }
      else {
        plVar3[uVar7].logit = __x->bias + plVar3[uVar7].logit;
      }
    }
    piVar4 = *(int **)((long)pvVar1 + 0x20);
    piVar5 = *(int **)((long)pvVar1 + 0x28);
    if (piVar4 != piVar5) {
      sVar6 = cur_p->size;
      for (sVar8 = 0; piVar9 = piVar4, sVar8 != sVar6; sVar8 = sVar8 + 1) {
        for (; piVar9 != piVar5; piVar9 = piVar9 + 2) {
          plVar3 = cur_p->data;
          if (plVar3[sVar8].id == *piVar9) {
            plVar3[sVar8].logit = (float)piVar9[1] + plVar3[sVar8].logit;
            break;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void llama_sampler_logit_bias_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_logit_bias *) smpl->ctx;

    if (ctx->logit_bias.empty()) {
        return;
    }

    ctx->to_search.clear();

    // update the candidates that have not been shuffled in the vocabulary (i.e. idx == id)
    for (const auto & lb : ctx->logit_bias) {
        if (lb.token >= 0 && cur_p->size > (size_t) lb.token && cur_p->data[lb.token].id == lb.token) {
            cur_p->data[lb.token].logit += lb.bias;
        } else {
            ctx->to_search.push_back(lb);
        }
    }

    if (ctx->to_search.empty()) {
        return;
    }

    // search for the remaining candidates that were not found in the previous step
    for (size_t i = 0; i < cur_p->size; ++i) {
        for (const auto & lb : ctx->to_search) {
            if (cur_p->data[i].id == lb.token) {
                cur_p->data[i].logit += lb.bias;
                break;
            }
        }
    }
}